

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::FillPatchIterator::FillPatchIterator
          (FillPatchIterator *this,AmrLevel *amrlevel,MultiFab *leveldata)

{
  MFIter::MFIter(&this->super_MFIter,(FabArrayBase *)leveldata,'\0');
  this->m_amrlevel = amrlevel;
  this->m_leveldata = leveldata;
  (this->m_range).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_range).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_range).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab(&this->m_fabs);
  this->m_ncomp = 0;
  MFIter::depth = 0;
  return;
}

Assistant:

FillPatchIterator::FillPatchIterator (AmrLevel& amrlevel,
                                      MultiFab& leveldata)
    :
    MFIter(leveldata),
    m_amrlevel(amrlevel),
    m_leveldata(leveldata),
    m_ncomp(0)
{
    MFIter::depth = 0;
}